

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.c
# Opt level: O0

int wally_tx_elements_issuance_generate_entropy
              (uchar *txhash,size_t txhash_len,uint32_t index,uchar *contract_hash,
              size_t contract_hash_len,uchar *bytes_out,size_t len)

{
  int local_bc;
  uchar local_b8 [4];
  int ret;
  uchar buff_2 [36];
  uchar local_88 [8];
  uchar buff [64];
  uchar *bytes_out_local;
  size_t contract_hash_len_local;
  uchar *contract_hash_local;
  uint32_t index_local;
  size_t txhash_len_local;
  uchar *txhash_local;
  
  if ((((txhash == (uchar *)0x0) || (txhash_len != 0x20)) || (contract_hash == (uchar *)0x0)) ||
     (((contract_hash_len != 0x20 || (bytes_out == (uchar *)0x0)) || (len != 0x20)))) {
    txhash_local._4_4_ = -2;
  }
  else {
    memcpy(local_b8,txhash,0x20);
    uint32_to_le_bytes(index,buff_2 + 0x18);
    local_bc = wally_sha256d(local_b8,0x24,local_88,0x20);
    if (local_bc == 0) {
      memcpy(buff + 0x18,contract_hash,0x20);
      local_bc = wally_sha256_midstate(local_88,0x40,bytes_out,0x20);
    }
    wally_clear_2(local_88,0x40,local_b8,0x24);
    txhash_local._4_4_ = local_bc;
  }
  return txhash_local._4_4_;
}

Assistant:

int wally_tx_elements_issuance_generate_entropy(const unsigned char *txhash,
                                                size_t txhash_len,
                                                uint32_t index,
                                                const unsigned char *contract_hash,
                                                size_t contract_hash_len,
                                                unsigned char *bytes_out,
                                                size_t len)
{
    unsigned char buff[2 * SHA256_LEN];
    unsigned char buff_2[WALLY_TXHASH_LEN + sizeof(uint32_t)];
    int ret;

    if (!txhash || txhash_len != WALLY_TXHASH_LEN ||
        !contract_hash || contract_hash_len != SHA256_LEN ||
        !bytes_out || len != SHA256_LEN)
        return WALLY_EINVAL;

    memcpy(buff_2, txhash, txhash_len);
    uint32_to_le_bytes(index, buff_2 + txhash_len);

    ret = wally_sha256d(buff_2, sizeof(buff_2), buff, SHA256_LEN);
    if (ret == WALLY_OK) {
        memcpy(buff + SHA256_LEN, contract_hash, contract_hash_len);
        ret = wally_sha256_midstate(buff, sizeof(buff), bytes_out, len);
    }

    wally_clear_2(buff, sizeof(buff), buff_2, sizeof(buff_2));
    return ret;
}